

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MppBufferGroupImpl * __thiscall
MppBufferService::get_group
          (MppBufferService *this,char *tag,char *caller,MppBufferMode mode,MppBufferType type,
          RK_U32 is_misc)

{
  MppBufferType MVar1;
  MppAllocFlagType MVar2;
  RK_U32 val;
  RK_U32 RVar3;
  Mutex *pMVar4;
  MppBufLogs *pMVar5;
  undefined1 local_80 [4];
  RK_U32 id;
  AutoMutex auto_lock;
  MppAllocatorApi *pMStack_68;
  pthread_mutexattr_t attr;
  MppAllocatorApi *alloc_api;
  MppAllocator allocator;
  AutoMutex auto_lock_1;
  RK_U32 flag;
  MppBufferGroupImpl *p;
  MppBufferType buffer_type;
  RK_U32 is_misc_local;
  MppBufferType type_local;
  MppBufferMode mode_local;
  char *caller_local;
  char *tag_local;
  MppBufferService *this_local;
  
  MVar1 = type & 0xffff;
  auto_lock_1.mLock._4_4_ = MPP_ALLOC_FLAG_NONE;
  mpp_env_get_u32("mpp_buffer_debug",&mpp_buffer_debug,mpp_buffer_debug);
  if (((int)mode < 2) && (MVar1 < MPP_BUFFER_TYPE_BUTT)) {
    this_local = (MppBufferService *)mpp_mem_pool_get_f(caller,mpp_buf_grp_pool);
    if (this_local == (MppBufferService *)0x0) {
      _mpp_log_l(2,"mpp_buffer","MppBufferService failed to allocate group context\n",(char *)0x0);
      this_local = (MppBufferService *)0x0;
    }
    else {
      if ((type & 0x200000) != MPP_BUFFER_TYPE_NORMAL) {
        auto_lock_1.mLock._4_4_ = auto_lock_1.mLock._4_4_ + MPP_ALLOC_FLAG_DMA32;
      }
      if ((type & 0x20000) != MPP_BUFFER_TYPE_NORMAL) {
        auto_lock_1.mLock._4_4_ = auto_lock_1.mLock._4_4_ + MPP_ALLOC_FLAG_CACHABLE;
      }
      if ((type & 0x10000) != MPP_BUFFER_TYPE_NORMAL) {
        auto_lock_1.mLock._4_4_ = auto_lock_1.mLock._4_4_ + MPP_ALLOC_FLAG_CMA;
      }
      this_local->misc[1][3] = auto_lock_1.mLock._4_4_;
      pMVar4 = get_lock();
      Mutex::Autolock::Autolock((Autolock *)&allocator,pMVar4,1);
      alloc_api = (MppAllocatorApi *)this->mAllocator[MVar1][auto_lock_1.mLock._4_4_];
      pMStack_68 = this->mAllocatorApi[MVar1];
      if (alloc_api == (MppAllocatorApi *)0x0) {
        mpp_allocator_get(&alloc_api,&stack0xffffffffffffff98,type,this_local->misc[1][3]);
        this->mAllocator[MVar1][auto_lock_1.mLock._4_4_] = alloc_api;
        this->mAllocatorApi[MVar1] = pMStack_68;
      }
      *(MppAllocatorApi **)(this_local->misc[0] + 4) = alloc_api;
      *(MppAllocatorApi **)(this_local->misc[1] + 1) = pMStack_68;
      MVar2 = mpp_allocator_get_flags(alloc_api);
      this_local->misc[1][3] = MVar2;
      Mutex::Autolock::~Autolock((Autolock *)&allocator);
      if ((*(MppAllocator *)(this_local->misc[0] + 4) == (MppAllocator)0x0) ||
         (*(MppAllocatorApi **)(this_local->misc[1] + 1) == (MppAllocatorApi *)0x0)) {
        mpp_mem_pool_put_f(caller,mpp_buf_grp_pool,this_local);
        _mpp_log_l(2,"mpp_buffer",
                   "MppBufferService get_group failed to get allocater with mode %d type %x\n",
                   (char *)0x0,(ulong)mode,(ulong)type);
        this_local = (MppBufferService *)0x0;
      }
      else {
        ((list_head *)(this_local->mAllocator + 3))->next =
             (list_head *)(this_local->mAllocator + 3);
        ((list_head *)(this_local->mAllocator + 3))->prev =
             (list_head *)(this_local->mAllocator + 3);
        ((list_head *)((hlist_node *)(this_local->mAllocator + 2) + 1))->next =
             (list_head *)((hlist_node *)(this_local->mAllocator + 2) + 1);
        ((list_head *)((hlist_node *)(this_local->mAllocator + 2) + 1))->prev =
             (list_head *)((hlist_node *)(this_local->mAllocator + 2) + 1);
        ((list_head *)((hlist_node *)(this_local->mAllocator + 2) + 2))->next =
             (list_head *)((hlist_node *)(this_local->mAllocator + 2) + 2);
        ((list_head *)((hlist_node *)(this_local->mAllocator + 2) + 2))->prev =
             (list_head *)((hlist_node *)(this_local->mAllocator + 2) + 2);
        INIT_HLIST_NODE((hlist_node *)(this_local->mAllocator + 2));
        this_local->misc[1][4] = (uint)((mpp_buffer_debug & 2) != 0);
        this_local->misc_count = (uint)((mpp_buffer_debug & 4) != 0);
        *(char **)(this_local->misc[0] + 2) = caller;
        *(MppBufferMode *)this_local->mAllocator[0] = mode;
        *(MppBufferType *)((long)this_local->mAllocator[0] + 4) = MVar1;
        this_local->mAllocator[0][6] = (MppAllocator)0x5000000;
        *(uint *)(this_local->mAllocator[0] + 1) = (uint)((mpp_buffer_debug & 0x10) != 0);
        *(uint *)((long)this_local->mAllocator[0] + 0xc) = (uint)((mpp_buffer_debug & 0x20) != 0);
        pthread_mutexattr_init((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
        pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4),1);
        pthread_mutex_init((pthread_mutex_t *)(this_local->mAllocator[1] + 3),
                           (pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
        pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&auto_lock.mLock + 4));
        if (this_local->misc_count != 0) {
          pMVar5 = buf_logs_init(0x400);
          *(MppBufLogs **)((long)((hlist_node *)(this_local->mAllocator + 2) + 3) + 8) = pMVar5;
        }
        pMVar4 = get_lock();
        Mutex::Autolock::Autolock((Autolock *)local_80,pMVar4,1);
        val = get_group_id(this);
        if (tag == (char *)0x0) {
          snprintf((char *)this_local,0x1f,"unknown");
        }
        else {
          snprintf((char *)this_local,0x1f,"%s_%d",tag,(ulong)val);
        }
        *(RK_U32 *)&this_local->field_0x44 = val;
        list_add_tail((list_head *)(this_local->mAllocator + 3),&this->mListGroup);
        RVar3 = hash_32(val,8);
        hlist_add_head((hlist_node *)(this_local->mAllocator + 2),this->mHashGroup + RVar3);
        buf_grp_add_log((MppBufferGroupImpl *)this_local,GRP_CREATE,caller);
        if (is_misc != 0) {
          this->misc[mode][MVar1] = val;
          *(RK_U32 *)(this_local->mAllocator[0] + 2) = 1;
          this->misc_count = this->misc_count + 1;
        }
        Mutex::Autolock::~Autolock((Autolock *)local_80);
      }
    }
  }
  else {
    _mpp_log_l(2,"mpp_buffer","MppBufferService get_group found invalid mode %d type %x\n",
               (char *)0x0,(ulong)mode,(ulong)type);
    this_local = (MppBufferService *)0x0;
  }
  return (MppBufferGroupImpl *)this_local;
}

Assistant:

MppBufferGroupImpl *MppBufferService::get_group(const char *tag, const char *caller,
                                                MppBufferMode mode, MppBufferType type,
                                                RK_U32 is_misc)
{
    MppBufferType buffer_type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    MppBufferGroupImpl *p = NULL;
    RK_U32 flag = MPP_ALLOC_FLAG_NONE;

    /* env update */
    mpp_env_get_u32("mpp_buffer_debug", &mpp_buffer_debug, mpp_buffer_debug);

    if (mode >= MPP_BUFFER_MODE_BUTT || buffer_type >= MPP_BUFFER_TYPE_BUTT) {
        mpp_err("MppBufferService get_group found invalid mode %d type %x\n", mode, type);
        return NULL;
    }

    p = (MppBufferGroupImpl *)mpp_mem_pool_get_f(caller, mpp_buf_grp_pool);
    if (!p) {
        mpp_err("MppBufferService failed to allocate group context\n");
        return NULL;
    }

    if (type & MPP_BUFFER_FLAGS_DMA32)
        flag += MPP_ALLOC_FLAG_DMA32;

    if (type & MPP_BUFFER_FLAGS_CACHABLE)
        flag += MPP_ALLOC_FLAG_CACHABLE;

    if (type & MPP_BUFFER_FLAGS_CONTIG)
        flag += MPP_ALLOC_FLAG_CMA;

    p->flags = (MppAllocFlagType)flag;

    {
        AutoMutex auto_lock(get_lock());
        MppAllocator allocator = NULL;
        MppAllocatorApi *alloc_api = NULL;

        allocator = mAllocator[buffer_type][flag];
        alloc_api = mAllocatorApi[buffer_type];

        // allocate general buffer first
        if (!allocator) {
            mpp_allocator_get(&allocator, &alloc_api, type, p->flags);
            mAllocator[buffer_type][flag] = allocator;
            mAllocatorApi[buffer_type] = alloc_api;
        }

        p->allocator = allocator;
        p->alloc_api = alloc_api;
        p->flags = mpp_allocator_get_flags(allocator);
    }

    if (!p->allocator || !p->alloc_api) {
        mpp_mem_pool_put_f(caller, mpp_buf_grp_pool, p);
        mpp_err("MppBufferService get_group failed to get allocater with mode %d type %x\n", mode, type);
        return NULL;
    }

    INIT_LIST_HEAD(&p->list_group);
    INIT_LIST_HEAD(&p->list_used);
    INIT_LIST_HEAD(&p->list_unused);
    INIT_HLIST_NODE(&p->hlist);

    p->log_runtime_en   = (mpp_buffer_debug & MPP_BUF_DBG_OPS_RUNTIME) ? (1) : (0);
    p->log_history_en   = (mpp_buffer_debug & MPP_BUF_DBG_OPS_HISTORY) ? (1) : (0);

    p->caller   = caller;
    p->mode     = mode;
    p->type     = buffer_type;
    p->limit    = BUFFER_GROUP_SIZE_DEFAULT;
    p->clear_on_exit = (mpp_buffer_debug & MPP_BUF_DBG_CLR_ON_EXIT) ? (1) : (0);
    p->dump_on_exit  = (mpp_buffer_debug & MPP_BUF_DBG_DUMP_ON_EXIT) ? (1) : (0);

    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&p->buf_lock, &attr);
    pthread_mutexattr_destroy(&attr);

    if (p->log_history_en)
        p->logs = buf_logs_init(BUFFER_OPS_MAX_COUNT);

    AutoMutex auto_lock(get_lock());
    RK_U32 id = get_group_id();

    if (tag) {
        snprintf(p->tag, sizeof(p->tag) - 1, "%s_%d", tag, id);
    } else {
        snprintf(p->tag, sizeof(p->tag) - 1, "unknown");
    }
    p->group_id = id;

    list_add_tail(&p->list_group, &mListGroup);
    hash_add(mHashGroup, &p->hlist, id);

    buf_grp_add_log(p, GRP_CREATE, caller);

    if (is_misc) {
        misc[mode][buffer_type] = id;
        p->is_misc = 1;
        misc_count++;
    }

    return p;
}